

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O1

void __thiscall OpenMD::TimeCorrFunc<int>::computeFrame(TimeCorrFunc<int> *this,int istep)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pvVar2;
  uint uVar3;
  Molecule *pMVar4;
  StuntDouble *pSVar5;
  Bond *pBVar6;
  long lVar7;
  uint *puVar8;
  iterator iVar9;
  vector<int,std::allocator<int>> *pvVar10;
  long lVar11;
  int ibond2;
  int ibond1;
  int isd2;
  int isd1;
  int imol2;
  int imol1;
  uint local_64;
  SelectionSet local_60;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_64 = istep;
  if ((this->evaluator1_).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator1_);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)
                 (CONCAT44(local_60.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_60.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start) + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[7])(this,&this->seleMan1_);
  }
  if ((this->uniqueSelections_ == true) && ((this->evaluator2_).isDynamic_ == true)) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator2_);
    lVar11 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar11),
                 (vector<bool,_std::allocator<bool>_> *)
                 (CONCAT44(local_60.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (int)local_60.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start) + lVar11));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[7])(this,&this->seleMan2_);
  }
  if (this->doSystemProperties_ == true) {
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[10])(this,(ulong)local_64);
    if (this->autoCorrFunc_ == false) {
      (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xb])(this,(ulong)local_64);
    }
  }
  if (this->doMolecularProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (long)this->info_->nGlobalMols_,(value_type_conflict2 *)&local_60);
    }
    pMVar4 = SelectionManager::beginSelectedMolecule(&this->seleMan1_,&local_34);
    if (pMVar4 != (Molecule *)0x0) {
      do {
        uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xd])
                          (this,(ulong)local_64,pMVar4);
        pvVar1 = (this->sele1ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
        iVar9._M_current =
             (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if ((long)iVar9._M_current -
            (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = pMVar4->globalIndex_;
          if (iVar9._M_current ==
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (pvVar1,iVar9,(int *)&local_60);
          }
          else {
            *iVar9._M_current =
                 (int)local_60.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar9._M_current + 1;
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
          *(int *)(*(long *)&(this->sele1ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar3 * 4) = pMVar4->globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar2 = (this->GIDtoSele1_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data + (long)pMVar4->globalIndex_ * 4) =
               uVar3;
          lVar11 = (long)(int)local_64;
          if (lVar11 == 0) {
            pvVar10 = (vector<int,std::allocator<int>> *)
                      (this->selection1StartFrame_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_00155b7d:
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
              puVar8 = &local_64;
LAB_00155b98:
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar10,iVar9,(int *)puVar8);
              goto LAB_00155b9d;
            }
            *iVar9._M_current = local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data +
                                  (long)pMVar4->globalIndex_ * 4);
            if (lVar7 == -1) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        ((this->selection1StartFrame_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11);
              goto LAB_00155b7d;
            }
            pvVar2 = (this->selection1StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar2[lVar11 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
            pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_00155b98;
            *iVar9._M_current = *puVar8;
          }
          *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
        }
LAB_00155b9d:
        if (this->uniqueSelections_ == false) {
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xe])(this,(ulong)local_64,pMVar4);
        }
        pMVar4 = SelectionManager::nextSelectedMolecule(&this->seleMan1_,&local_34);
      } while (pMVar4 != (Molecule *)0x0);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (long)this->info_->nGlobalMols_,(value_type_conflict2 *)&local_60);
      }
      pMVar4 = SelectionManager::beginSelectedMolecule(&this->seleMan2_,&local_38);
      if (pMVar4 != (Molecule *)0x0) {
        do {
          uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                    [(ulong)(this->autoCorrFunc_ ^ 1) + 0xd])(this,(ulong)local_64,pMVar4);
          pvVar1 = (this->sele2ToIndex_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
          iVar9._M_current =
               (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if ((long)iVar9._M_current -
              (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
            local_60.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = pMVar4->globalIndex_;
            if (iVar9._M_current ==
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (pvVar1,iVar9,(int *)&local_60);
            }
            else {
              *iVar9._M_current =
                   (int)local_60.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
            *(int *)(*(long *)&(this->sele2ToIndex_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (ulong)uVar3 * 4) = pMVar4->globalIndex_;
          }
          if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
            pvVar2 = (this->GIDtoSele2_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + (long)pMVar4->globalIndex_ * 4) =
                 uVar3;
            lVar11 = (long)(int)local_64;
            if (lVar11 == 0) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        (this->selection2StartFrame_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00155d4b:
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
                puVar8 = &local_64;
LAB_00155d66:
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar10,iVar9,(int *)puVar8);
                goto LAB_00155d6b;
              }
              *iVar9._M_current = local_64;
            }
            else {
              lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data +
                                    (long)pMVar4->globalIndex_ * 4);
              if (lVar7 == -1) {
                pvVar10 = (vector<int,std::allocator<int>> *)
                          ((this->selection2StartFrame_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11);
                goto LAB_00155d4b;
              }
              pvVar2 = (this->selection2StartFrame_).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar8 = (uint *)(lVar7 * 4 +
                               *(long *)&pvVar2[lVar11 + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data);
              pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_00155d66;
              *iVar9._M_current = *puVar8;
            }
            *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
          }
LAB_00155d6b:
          pMVar4 = SelectionManager::nextSelectedMolecule(&this->seleMan2_,&local_38);
        } while (pMVar4 != (Molecule *)0x0);
      }
    }
  }
  if (this->doObjectProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (long)this->info_->nGlobalIntegrableObjects_,(value_type_conflict2 *)&local_60);
    }
    pSVar5 = SelectionManager::beginSelected(&this->seleMan1_,&local_3c);
    if (pSVar5 != (StuntDouble *)0x0) {
      do {
        uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xf])
                          (this,(ulong)local_64,pSVar5);
        pvVar1 = (this->sele1ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
        iVar9._M_current =
             (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if ((long)iVar9._M_current -
            (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = pSVar5->globalIndex_;
          if (iVar9._M_current ==
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (pvVar1,iVar9,(int *)&local_60);
          }
          else {
            *iVar9._M_current =
                 (int)local_60.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar9._M_current + 1;
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
          *(int *)(*(long *)&(this->sele1ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar3 * 4) = pSVar5->globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar2 = (this->GIDtoSele1_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data + (long)pSVar5->globalIndex_ * 4) =
               uVar3;
          lVar11 = (long)(int)local_64;
          if (lVar11 == 0) {
            pvVar10 = (vector<int,std::allocator<int>> *)
                      (this->selection1StartFrame_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_00155ef5:
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
              puVar8 = &local_64;
LAB_00155f10:
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar10,iVar9,(int *)puVar8);
              goto LAB_00155f15;
            }
            *iVar9._M_current = local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data +
                                  (long)pSVar5->globalIndex_ * 4);
            if (lVar7 == -1) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        ((this->selection1StartFrame_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11);
              goto LAB_00155ef5;
            }
            pvVar2 = (this->selection1StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar2[lVar11 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
            pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_00155f10;
            *iVar9._M_current = *puVar8;
          }
          *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
        }
LAB_00155f15:
        if (this->uniqueSelections_ == false) {
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x10])(this,(ulong)local_64,pSVar5);
        }
        pSVar5 = SelectionManager::nextSelected(&this->seleMan1_,&local_3c);
      } while (pSVar5 != (StuntDouble *)0x0);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (long)this->info_->nGlobalIntegrableObjects_,(value_type_conflict2 *)&local_60);
      }
      pSVar5 = SelectionManager::beginSelected(&this->seleMan2_,&local_40);
      if (pSVar5 != (StuntDouble *)0x0) {
        do {
          uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                    [(ulong)(this->autoCorrFunc_ ^ 1) + 0xf])(this,(ulong)local_64,pSVar5);
          pvVar1 = (this->sele2ToIndex_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
          iVar9._M_current =
               (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if ((long)iVar9._M_current -
              (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
            local_60.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = pSVar5->globalIndex_;
            if (iVar9._M_current ==
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (pvVar1,iVar9,(int *)&local_60);
            }
            else {
              *iVar9._M_current =
                   (int)local_60.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
            *(int *)(*(long *)&(this->sele2ToIndex_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (ulong)uVar3 * 4) = pSVar5->globalIndex_;
          }
          if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
            pvVar2 = (this->GIDtoSele2_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + (long)pSVar5->globalIndex_ * 4) =
                 uVar3;
            lVar11 = (long)(int)local_64;
            if (lVar11 == 0) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        (this->selection2StartFrame_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_001560c6:
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
                puVar8 = &local_64;
LAB_001560e1:
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar10,iVar9,(int *)puVar8);
                goto LAB_001560e6;
              }
              *iVar9._M_current = local_64;
            }
            else {
              lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data +
                                    (long)pSVar5->globalIndex_ * 4);
              if (lVar7 == -1) {
                pvVar10 = (vector<int,std::allocator<int>> *)
                          ((this->selection2StartFrame_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11);
                goto LAB_001560c6;
              }
              pvVar2 = (this->selection2StartFrame_).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar8 = (uint *)(lVar7 * 4 +
                               *(long *)&pvVar2[lVar11 + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data);
              pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_001560e1;
              *iVar9._M_current = *puVar8;
            }
            *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
          }
LAB_001560e6:
          pSVar5 = SelectionManager::nextSelected(&this->seleMan2_,&local_40);
        } while (pSVar5 != (StuntDouble *)0x0);
      }
    }
  }
  if (this->doBondProperties_ == true) {
    if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
      local_60.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = -1;
      std::vector<int,_std::allocator<int>_>::resize
                ((this->GIDtoSele1_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                 (ulong)(uint)this->info_->nGlobalBonds_,(value_type_conflict2 *)&local_60);
    }
    pBVar6 = SelectionManager::beginSelectedBond(&this->seleMan1_,&local_44);
    if (pBVar6 != (Bond *)0x0) {
      do {
        uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x11])
                          (this,(ulong)local_64,pBVar6);
        pvVar1 = (this->sele1ToIndex_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
        iVar9._M_current =
             (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if ((long)iVar9._M_current -
            (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
          local_60.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (pBVar6->super_ShortRangeInteraction).globalIndex_;
          if (iVar9._M_current ==
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (pvVar1,iVar9,(int *)&local_60);
          }
          else {
            *iVar9._M_current =
                 (int)local_60.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar9._M_current + 1;
          }
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
          *(int *)(*(long *)&(this->sele1ToIndex_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar3 * 4) =
               (pBVar6->super_ShortRangeInteraction).globalIndex_;
        }
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar2 = (this->GIDtoSele1_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data +
                   (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4) = uVar3;
          lVar11 = (long)(int)local_64;
          if (lVar11 == 0) {
            pvVar10 = (vector<int,std::allocator<int>> *)
                      (this->selection1StartFrame_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_00156272:
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
              puVar8 = &local_64;
LAB_0015628d:
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar10,iVar9,(int *)puVar8);
              goto LAB_00156292;
            }
            *iVar9._M_current = local_64;
          }
          else {
            lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data +
                                  (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4);
            if (lVar7 == -1) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        ((this->selection1StartFrame_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11);
              goto LAB_00156272;
            }
            pvVar2 = (this->selection1StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar8 = (uint *)(lVar7 * 4 +
                             *(long *)&pvVar2[lVar11 + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data);
            pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
            iVar9._M_current = *(int **)(pvVar10 + 8);
            if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_0015628d;
            *iVar9._M_current = *puVar8;
          }
          *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
        }
LAB_00156292:
        if (this->uniqueSelections_ == false) {
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x12])(this,(ulong)local_64,pBVar6);
        }
        pBVar6 = SelectionManager::nextSelectedBond(&this->seleMan1_,&local_44);
      } while (pBVar6 != (Bond *)0x0);
    }
    if (this->uniqueSelections_ == true) {
      if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
        local_60.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = -1;
        std::vector<int,_std::allocator<int>_>::resize
                  ((this->GIDtoSele2_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64,
                   (ulong)(uint)this->info_->nGlobalBonds_,(value_type_conflict2 *)&local_60);
      }
      pBVar6 = SelectionManager::beginSelectedBond(&this->seleMan2_,&local_48);
      if (pBVar6 != (Bond *)0x0) {
        do {
          uVar3 = (*(this->super_DynamicProperty)._vptr_DynamicProperty
                    [(ulong)(this->autoCorrFunc_ ^ 1) + 0x11])(this,(ulong)local_64,pBVar6);
          pvVar1 = (this->sele2ToIndex_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)local_64;
          iVar9._M_current =
               (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if ((long)iVar9._M_current -
              (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2 == (ulong)uVar3) {
            local_60.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 (pBVar6->super_ShortRangeInteraction).globalIndex_;
            if (iVar9._M_current ==
                (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (pvVar1,iVar9,(int *)&local_60);
            }
            else {
              *iVar9._M_current =
                   (int)local_60.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::resize(pvVar1,(ulong)(uVar3 + 1));
            *(int *)(*(long *)&(this->sele2ToIndex_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(int)local_64].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (ulong)uVar3 * 4) =
                 (pBVar6->super_ShortRangeInteraction).globalIndex_;
          }
          if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
            pvVar2 = (this->GIDtoSele2_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(uint *)(*(long *)&pvVar2[(int)local_64].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data +
                     (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4) = uVar3;
            lVar11 = (long)(int)local_64;
            if (lVar11 == 0) {
              pvVar10 = (vector<int,std::allocator<int>> *)
                        (this->selection2StartFrame_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00156445:
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) {
                puVar8 = &local_64;
LAB_00156460:
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar10,iVar9,(int *)puVar8);
                goto LAB_00156465;
              }
              *iVar9._M_current = local_64;
            }
            else {
              lVar7 = (long)*(int *)(*(long *)&pvVar2[lVar11 + -1].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data +
                                    (long)(pBVar6->super_ShortRangeInteraction).globalIndex_ * 4);
              if (lVar7 == -1) {
                pvVar10 = (vector<int,std::allocator<int>> *)
                          ((this->selection2StartFrame_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11);
                goto LAB_00156445;
              }
              pvVar2 = (this->selection2StartFrame_).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar8 = (uint *)(lVar7 * 4 +
                               *(long *)&pvVar2[lVar11 + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data);
              pvVar10 = (vector<int,std::allocator<int>> *)(pvVar2 + lVar11);
              iVar9._M_current = *(int **)(pvVar10 + 8);
              if ((uint *)iVar9._M_current == *(uint **)(pvVar10 + 0x10)) goto LAB_00156460;
              *iVar9._M_current = *puVar8;
            }
            *(uint **)(pvVar10 + 8) = (uint *)iVar9._M_current + 1;
          }
LAB_00156465:
          pBVar6 = SelectionManager::nextSelectedBond(&this->seleMan2_,&local_48);
        } while (pBVar6 != (Bond *)0x0);
      }
    }
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::computeFrame(int istep) {
    Molecule* mol;
    StuntDouble* sd;
    Bond* bond;
    int imol1, imol2, isd1, isd2, ibond1, ibond2;
    unsigned int index;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection(seleMan1_);
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection(seleMan2_);
    }

    if (doSystemProperties_) {
      computeProperty1(istep);
      if (!autoCorrFunc_) computeProperty2(istep);
    }

    if (doMolecularProperties_) {
      // Map of molecular global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalMolecules(), -1);

      for (mol = seleMan1_.beginSelectedMolecule(imol1); mol != NULL;
           mol = seleMan1_.nextSelectedMolecule(imol1)) {
        index = computeProperty1(istep, mol);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(mol->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = mol->getGlobalIndex();
        }
	if (selectionModeRestart_) {
	  GIDtoSele1_[istep][mol->getGlobalIndex()] = index;
	  
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][mol->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, mol); }
      }

      if (uniqueSelections_) {
	// Map of molecular global IDs to selections
	if (selectionModeRestart_) 	  
	  GIDtoSele2_[istep].resize(info_->getNGlobalMolecules(), -1);

        for (mol = seleMan2_.beginSelectedMolecule(imol2); mol != NULL;
             mol = seleMan2_.nextSelectedMolecule(imol2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, mol);
          } else {
            index = computeProperty2(istep, mol);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(mol->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = mol->getGlobalIndex();
          }
	  if (selectionModeRestart_) {
	    
	    GIDtoSele2_[istep][mol->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][mol->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else 	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }	  
        }
      }
    }

    if (doObjectProperties_) {
      // Map of StuntDouble global IDs to selections
      if (selectionModeRestart_)	
	GIDtoSele1_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
      
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        index = computeProperty1(istep, sd);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(sd->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = sd->getGlobalIndex();
        }

	if (selectionModeRestart_) {

	  GIDtoSele1_[istep][sd->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][sd->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, sd); }
      }

      if (uniqueSelections_) {
	// Map of StuntDouble global IDs to selections
	if (selectionModeRestart_)
	  GIDtoSele2_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
	
        for (sd = seleMan2_.beginSelected(isd2); sd != NULL;
             sd = seleMan2_.nextSelected(isd2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, sd);
          } else {
            index = computeProperty2(istep, sd);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(sd->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = sd->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][sd->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][sd->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }

    if (doBondProperties_) {
      // Map of bond global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalBonds(), -1);

      for (bond = seleMan1_.beginSelectedBond(ibond1); bond != NULL;
           bond = seleMan1_.nextSelectedBond(ibond1)) {
        index = computeProperty1(istep, bond);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(bond->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = bond->getGlobalIndex();
        }

	if (selectionModeRestart_) {
	  
	  GIDtoSele1_[istep][bond->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][bond->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}
	
        if (!uniqueSelections_) { index = computeProperty2(istep, bond); }
      }

      if (uniqueSelections_) {
	// Map of bond global IDs to selections
	if (selectionModeRestart_) 	 
	  GIDtoSele2_[istep].resize(info_->getNGlobalBonds(), -1);

        for (bond = seleMan2_.beginSelectedBond(ibond2); bond != NULL;
             bond = seleMan2_.nextSelectedBond(ibond2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, bond);
          } else {
            index = computeProperty2(istep, bond);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(bond->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = bond->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][bond->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][bond->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }
  }